

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linde_buzo_gray_algorithm.cc
# Opt level: O2

void __thiscall
sptk::LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
          (LindeBuzoGrayAlgorithm *this,int num_order,int initial_codebook_size,
          int target_codebook_size,int min_num_vector_in_cluster,int num_iteration,
          double convergence_threshold,double splitting_factor,int seed)

{
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  int iVar2;
  
  this->_vptr_LindeBuzoGrayAlgorithm = (_func_int **)&PTR__LindeBuzoGrayAlgorithm_00114c18;
  this->num_order_ = num_order;
  this->initial_codebook_size_ = initial_codebook_size;
  this->target_codebook_size_ = target_codebook_size;
  this->min_num_vector_in_cluster_ = min_num_vector_in_cluster;
  this->num_iteration_ = num_iteration;
  this->convergence_threshold_ = convergence_threshold;
  this->splitting_factor_ = splitting_factor;
  this->seed_ = seed;
  DistanceCalculation::DistanceCalculation(&this->distance_calculation_,num_order,kSquaredEuclidean)
  ;
  StatisticsAccumulation::StatisticsAccumulation
            (&this->statistics_accumulation_,this->num_order_,1,false,false);
  VectorQuantization::VectorQuantization(&this->vector_quantization_,this->num_order_);
  this->is_valid_ = true;
  if ((((this->num_order_ < 0) ||
       (auVar1._4_4_ = -(uint)(this->initial_codebook_size_ < this->target_codebook_size_),
       auVar1._0_4_ = -(uint)(0 < this->initial_codebook_size_),
       auVar1._8_4_ = -(uint)(0 < this->min_num_vector_in_cluster_),
       auVar1._12_4_ = -(uint)(0 < this->num_iteration_), iVar2 = movmskps(extraout_EAX,auVar1),
       iVar2 != 0xf)) || (this->splitting_factor_ <= 0.0)) ||
     (((this->convergence_threshold_ <= 0.0 && this->convergence_threshold_ != 0.0 ||
       ((this->distance_calculation_).is_valid_ != true)) ||
      (((this->statistics_accumulation_).is_valid_ != true ||
       ((this->vector_quantization_).is_valid_ == false)))))) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm(
    int num_order, int initial_codebook_size, int target_codebook_size,
    int min_num_vector_in_cluster, int num_iteration,
    double convergence_threshold, double splitting_factor, int seed)
    : num_order_(num_order),
      initial_codebook_size_(initial_codebook_size),
      target_codebook_size_(target_codebook_size),
      min_num_vector_in_cluster_(min_num_vector_in_cluster),
      num_iteration_(num_iteration),
      convergence_threshold_(convergence_threshold),
      splitting_factor_(splitting_factor),
      seed_(seed),
      distance_calculation_(
          num_order_, DistanceCalculation::DistanceMetrics::kSquaredEuclidean),
      statistics_accumulation_(num_order_, 1),
      vector_quantization_(num_order_),
      is_valid_(true) {
  if (num_order_ < 0 || initial_codebook_size_ <= 0 ||
      target_codebook_size_ <= initial_codebook_size_ ||
      min_num_vector_in_cluster_ <= 0 || num_iteration_ <= 0 ||
      convergence_threshold_ < 0.0 || splitting_factor_ <= 0.0 ||
      !distance_calculation_.IsValid() || !statistics_accumulation_.IsValid() ||
      !vector_quantization_.IsValid()) {
    is_valid_ = false;
    return;
  }
}